

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O2

void lws_buflist_destroy_all_segments(lws_buflist **head)

{
  lws_buflist *plVar1;
  lws_buflist *ptr;
  
  ptr = *head;
  while (ptr != (lws_buflist *)0x0) {
    plVar1 = ptr->next;
    ptr->next = (lws_buflist *)0x0;
    lws_realloc(ptr,0,"lws_free");
    ptr = plVar1;
  }
  *head = (lws_buflist *)0x0;
  return;
}

Assistant:

void
lws_buflist_destroy_all_segments(struct lws_buflist **head)
{
	struct lws_buflist *p = *head, *p1;

	while (p) {
		p1 = p->next;
		p->next = NULL;
		lws_free(p);
		p = p1;
	}

	*head = NULL;
}